

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O3

int64_t primesum::pi_lmo4(int64_t x)

{
  ulong *puVar1;
  pointer *ppcVar2;
  long *plVar3;
  pointer pcVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  int128_t *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  pointer piVar17;
  pointer pcVar18;
  int64_t pos;
  long lVar19;
  ulong uVar20;
  int64_t iVar21;
  long extraout_RDX;
  int *piVar22;
  vector<char,_std::allocator<char>_> *sieve_00;
  long lVar23;
  ulong uVar24;
  size_type sVar25;
  int64_t m;
  vector<char,_std::allocator<char>_> *pvVar26;
  bool bVar27;
  vector<int,_std::allocator<int>_> primes;
  vector<char,_std::allocator<char>_> sieve;
  vector<long,_std::allocator<long>_> next;
  vector<int,_std::allocator<int>_> mu;
  vector<__int128,_std::allocator<__int128>_> phi;
  vector<int,_std::allocator<int>_> lpf;
  int256_t s1;
  int256_t p2;
  undefined1 in_stack_fffffffffffffe58 [16];
  vector<int,_std::allocator<int>_> local_190;
  vector<char,_std::allocator<char>_> *local_178;
  ulong local_170;
  int64_t local_168;
  ulong local_160;
  BinaryIndexedTree local_158;
  vector<char,_std::allocator<char>_> local_138;
  long local_120;
  long local_118;
  long local_110;
  void *local_108 [2];
  long local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  vector<__int128,_std::allocator<__int128>_> local_d8;
  long local_c0;
  size_type local_b8;
  ulong local_b0;
  ulong local_a8;
  BinaryIndexedTree *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar21 = 0;
  }
  else {
    dVar8 = get_alpha_lmo((primesum *)x,(int128_t)in_stack_fffffffffffffe58);
    dVar9 = pow((double)x,0.3333333333333333);
    lVar14 = (long)dVar9;
    if (0 < lVar14) {
      do {
        if (lVar14 * lVar14 - x / lVar14 == 0 || lVar14 * lVar14 < x / lVar14) goto LAB_001201dc;
        bVar27 = 1 < lVar14;
        lVar14 = lVar14 + -1;
      } while (bVar27);
      lVar14 = 0;
    }
LAB_001201dc:
    lVar14 = lVar14 + -1;
    do {
      lVar23 = lVar14 + 2;
      lVar14 = lVar14 + 1;
    } while (lVar23 * lVar23 - x / lVar23 == 0 || lVar23 * lVar23 < x / lVar23);
    pvVar26 = (vector<char,_std::allocator<char>_> *)(long)(dVar8 * (double)lVar14);
    lVar14 = 6;
    if ((long)pvVar26 < 0xd) {
      lVar14 = (long)(int)(&PhiTiny::pi)[(long)pvVar26];
    }
    P2(&local_58,(primesum *)x,(int128_t)in_stack_fffffffffffffe58,0,(int)pvVar26);
    generate_moebius(&local_f0,(int64_t)pvVar26);
    generate_lpf(&local_90,(int64_t)pvVar26);
    generate_primes(&local_190,(int64_t)pvVar26);
    S1(&local_78,(primesum *)x,(int128_t)in_stack_fffffffffffffe58,0,(int64_t)pvVar26,(int)lVar14);
    local_118 = x / (long)pvVar26;
    uVar24 = local_118 + 1;
    dVar8 = (double)(long)uVar24;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    lVar23 = 0xb504f333;
    if ((long)dVar8 < 0xb504f333) {
      lVar23 = (long)dVar8;
    }
    lVar15 = lVar23 * 2;
    do {
      lVar19 = lVar23 * lVar23;
      lVar15 = lVar15 + -2;
      lVar16 = lVar23;
      lVar23 = lVar23 + -1;
    } while (lVar19 - uVar24 != 0 && (long)uVar24 <= lVar19);
    do {
      lVar23 = lVar16;
      lVar15 = lVar15 + 2;
      lVar16 = lVar23 + 1;
    } while (lVar15 < (long)(uVar24 - lVar23 * lVar23));
    sVar25 = 1;
    if (lVar23 + 1 != 1) {
      uVar12 = lVar23 - 1;
      lVar23 = 1;
      do {
        uVar12 = (long)uVar12 >> ((byte)lVar23 & 0x3f) | uVar12;
        bVar27 = lVar23 < 0x20;
        lVar23 = lVar23 * 2;
      } while (bVar27);
      sVar25 = uVar12 + 1;
    }
    piVar22 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
    piVar11 = piVar22;
    uVar12 = (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar22 >> 2;
    while (piVar10 = piVar11, 0 < (long)uVar12) {
      uVar20 = uVar12 >> 1;
      piVar11 = piVar10 + uVar20 + 1;
      uVar12 = ~uVar20 + uVar12;
      if ((long)pvVar26 < (long)(piVar10 + uVar20 + 1)[-1]) {
        piVar11 = piVar10;
        uVar12 = uVar20;
      }
    }
    local_120 = lVar14;
    std::vector<char,_std::allocator<char>_>::vector(&local_138,sVar25,(allocator_type *)&local_158)
    ;
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<long,std::allocator<long>> *)local_108,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_158);
    sieve_00 = (vector<char,_std::allocator<char>_> *)
               ((long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2);
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<__int128,_std::allocator<__int128>_>::vector
              (&local_d8,(size_type)sieve_00,(value_type_conflict1 *)&local_158,
               (allocator_type *)&stack0xfffffffffffffe67);
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.size_ = 0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_118 < 1) {
      uVar24 = 0;
    }
    else {
      local_110 = (long)piVar10 - (long)piVar22 >> 2;
      local_c0 = local_120 + 1;
      lVar14 = -1;
      local_170 = 0;
      local_98 = 0;
      uVar12 = 1;
      local_178 = pvVar26;
      local_168 = x;
      local_b8 = sVar25;
      local_b0 = uVar24;
      do {
        sVar25 = local_b8;
        lVar23 = local_120;
        if (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1,
                 (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        local_a8 = sVar25 + uVar12;
        uVar24 = local_a8;
        if ((long)local_b0 < (long)local_a8) {
          uVar24 = local_b0;
        }
        if (0 < lVar23) {
          lVar15 = 1;
          do {
            lVar16 = *(long *)((long)local_108[0] + lVar15 * 8);
            if (lVar16 < (long)uVar24) {
              iVar5 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15];
              do {
                *(undefined1 *)
                 ((long)&(((_Vector_base<char,_std::allocator<char>_> *)
                          local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                         _M_start + lVar16 + lVar14) = 0;
                lVar16 = lVar16 + iVar5;
              } while (lVar16 < (long)uVar24);
            }
            *(long *)((long)local_108[0] + lVar15 * 8) = lVar16;
            bVar27 = lVar15 != lVar23;
            lVar15 = lVar15 + 1;
          } while (bVar27);
        }
        sieve_00 = &local_138;
        BinaryIndexedTree::init<std::vector<char,std::allocator<char>>>(&local_158,sieve_00,uVar12);
        if (local_c0 < local_110) {
          local_a0 = (BinaryIndexedTree *)(~uVar12 + uVar24);
          lVar23 = local_c0;
          local_160 = uVar12;
          do {
            iVar5 = local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar23];
            lVar19 = (long)iVar5;
            lVar16 = x / (long)(uVar24 * lVar19);
            lVar15 = (long)local_178 / lVar19;
            if ((long)local_178 / lVar19 < lVar16) {
              lVar15 = lVar16;
            }
            pvVar26 = (vector<char,_std::allocator<char>_> *)(x / (long)(local_160 * lVar19));
            iVar21 = x % (long)(local_160 * lVar19);
            if ((long)local_178 <= (long)pvVar26) {
              pvVar26 = local_178;
            }
            sieve_00 = local_178;
            if ((long)pvVar26 <= lVar19) break;
            if (lVar15 < (long)pvVar26) {
              lVar16 = (long)pvVar26 * lVar19;
              piVar17 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                if ((piVar17[(long)pvVar26] != 0) &&
                   (iVar5 < local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)pvVar26])) {
                  piVar13 = BinaryIndexedTree::sum
                                      ((int128_t *)&local_158,
                                       (BinaryIndexedTree *)(local_168 / lVar16 - local_160),
                                       local_168 % lVar16);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = (long)piVar13 +
                                 *(ulong *)(local_d8.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar23);
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[(long)pvVar26] * lVar16;
                  uVar12 = SUB168(auVar6 * auVar7,0);
                  iVar21 = SUB168(auVar6 * auVar7,8) +
                           (*(long *)((long)local_d8.
                                            super__Vector_base<__int128,_std::allocator<__int128>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     lVar23 * 0x10 + 8) +
                           (ulong)CARRY8((ulong)piVar13,
                                         *(ulong *)(local_d8.
                                                  super__Vector_base<__int128,_std::allocator<__int128>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar23
                                                  ))) *
                           local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pvVar26] * lVar16;
                  bVar27 = local_170 < uVar12;
                  local_170 = local_170 - uVar12;
                  local_98 = (local_98 - iVar21) - (ulong)bVar27;
                  piVar17 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                }
                pvVar26 = (vector<char,_std::allocator<char>_> *)
                          ((long)&pvVar26[-1].super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                lVar16 = lVar16 - lVar19;
              } while (lVar15 < (long)pvVar26);
            }
            piVar13 = BinaryIndexedTree::sum((int128_t *)&local_158,local_a0,iVar21);
            sieve_00 = (vector<char,_std::allocator<char>_> *)(lVar23 * 0x10);
            puVar1 = (ulong *)(local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar23);
            uVar12 = *puVar1;
            *puVar1 = *puVar1 + (long)piVar13;
            plVar3 = (long *)((long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                             (long)&(sieve_00->super__Vector_base<char,_std::allocator<char>_>).
                                    _M_impl.super__Vector_impl_data._M_finish);
            *plVar3 = *plVar3 + extraout_RDX + (ulong)CARRY8(uVar12,(ulong)piVar13);
            pcVar18 = *(pointer *)((long)local_108[0] + lVar23 * 8);
            if ((long)pcVar18 < (long)uVar24) {
              do {
                lVar15 = (long)pcVar18 - local_160;
                sieve_00 = (vector<char,_std::allocator<char>_> *)
                           local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                if (*(char *)((long)local_138.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar15) != '\0') {
                  *(undefined1 *)
                   ((long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar15) = 0;
                  uVar12 = lVar15 >> 1;
                  do {
                    ppcVar2 = &(((_Vector_base<char,_std::allocator<char>_> *)
                                local_158.tree_.
                                super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                               _M_start + uVar12 * 2;
                    pcVar4 = *ppcVar2;
                    *ppcVar2 = *ppcVar2 + -(long)pcVar18;
                    ppcVar2 = &(((_Vector_base<char,_std::allocator<char>_> *)
                                local_158.tree_.
                                super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                               _M_finish + uVar12 * 2;
                    *ppcVar2 = *ppcVar2 + (-(ulong)(pcVar4 < pcVar18) - ((long)pcVar18 >> 0x3f));
                    uVar12 = uVar12 | uVar12 + 1;
                    sieve_00 = (vector<char,_std::allocator<char>_> *)
                               local_158.tree_.
                               super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                               super__Vector_impl_data._M_start;
                  } while ((long)uVar12 < local_158.size_);
                }
                pcVar18 = pcVar18 + lVar19 * 2;
              } while ((long)pcVar18 < (long)uVar24);
            }
            *(pointer *)((long)local_108[0] + lVar23 * 8) = pcVar18;
            lVar23 = lVar23 + 1;
            x = local_168;
          } while (lVar23 != local_110);
        }
        lVar14 = lVar14 - local_b8;
        uVar12 = local_a8;
      } while ((long)local_a8 <= local_118);
      uVar24 = local_170;
      pvVar26 = local_178;
      if ((vector<char,_std::allocator<char>_> *)
          local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
          super__Vector_impl_data._M_start != (vector<char,_std::allocator<char>_> *)0x0) {
        sieve_00 = (vector<char,_std::allocator<char>_> *)
                   ((long)local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>.
                         _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_158.tree_.super__Vector_base<__int128,_std::allocator<__int128>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)sieve_00);
        uVar24 = local_170;
        pvVar26 = local_178;
      }
    }
    if (local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      sieve_00 = (vector<char,_std::allocator<char>_> *)
                 ((long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                       super__Vector_impl_data._M_start);
      operator_delete(local_d8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)sieve_00);
    }
    if (local_108[0] != (void *)0x0) {
      sieve_00 = (vector<char,_std::allocator<char>_> *)(local_f8 - (long)local_108[0]);
      operator_delete(local_108[0],(ulong)sieve_00);
    }
    if ((vector<char,_std::allocator<char>_> *)
        local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (vector<char,_std::allocator<char>_> *)0x0) {
      sieve_00 = (vector<char,_std::allocator<char>_> *)
                 (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage +
                 -(long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      operator_delete(local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)sieve_00);
    }
    piVar13 = prime_sum_tiny((int128_t *)pvVar26,(int64_t)sieve_00);
    if (local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar21 = (long)piVar13 + ~(ulong)local_58.low + (long)local_78.low + uVar24;
  }
  return iVar21;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}